

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hawktracer.cpp
# Opt level: O3

HT_TimelineListenerContainer * ht_timeline_listener_container_create(void)

{
  HT_ErrorCode HVar1;
  HT_TimelineListenerContainer *bag;
  HT_Mutex *pHVar2;
  
  if (realloc_fnc_ == (realloc_function)0x0) {
    bag = (HT_TimelineListenerContainer *)malloc(0x30);
  }
  else {
    bag = (HT_TimelineListenerContainer *)(*realloc_fnc_)((void *)0x0,0x30,user_data_);
  }
  if (bag != (HT_TimelineListenerContainer *)0x0) {
    HVar1 = ht_bag_listener_init(&bag->entries,0x10);
    if (HVar1 == HT_ERR_OK) {
      pHVar2 = ht_mutex_create();
      bag->mutex = pHVar2;
      if (pHVar2 != (HT_Mutex *)0x0) {
        bag->id = 0;
        bag->refcount = 1;
        return bag;
      }
      ht_bag_listener_deinit(&bag->entries);
    }
    if (realloc_fnc_ == (realloc_function)0x0) {
      free(bag);
    }
    else {
      (*realloc_fnc_)(bag,0,user_data_);
    }
  }
  return (HT_TimelineListenerContainer *)0x0;
}

Assistant:

HT_TimelineListenerContainer*
ht_timeline_listener_container_create(void)
{
    HT_TimelineListenerContainer* container = HT_CREATE_TYPE(HT_TimelineListenerContainer);

    if (container == NULL)
    {
        goto done;
    }

    if (ht_bag_listener_init(&container->entries, 16) != HT_ERR_OK)
    {
        goto error_init_entries;
    }

    container->mutex = ht_mutex_create();
    if (container->mutex == NULL)
    {
        goto error_create_mutex;
    }

    container->id = 0;
    container->refcount = 1;
    goto done;

error_create_mutex:
    ht_bag_listener_deinit(&container->entries);
error_init_entries:
    ht_free(container);
    container = NULL;
done:
    return container;
}